

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

int decoder_get_length(ndn_decoder_t *decoder,uint32_t *length)

{
  int iVar1;
  uint32_t *length_local;
  ndn_decoder_t *decoder_local;
  
  iVar1 = decoder_get_var(decoder,length);
  return iVar1;
}

Assistant:

static inline int
decoder_get_length(ndn_decoder_t* decoder, uint32_t* length)
{
  return decoder_get_var(decoder, length);
}